

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O3

Bus_Man_t * Bus_ManStart(Abc_Ntk_t *pNtk,SC_Lib *pLib,SC_BusPars *pPars)

{
  uint uVar1;
  long *plVar2;
  long lVar3;
  char *__s;
  int iVar4;
  Bus_Man_t *pBVar5;
  SC_Cell *pSVar6;
  SC_WireLoad *pWL;
  char *__dest;
  Vec_Ptr_t *pVVar7;
  void **ppvVar8;
  Vec_Flt_t *pVVar9;
  float *__ptr;
  Vec_Flt_t *pVVar10;
  float *__ptr_00;
  Vec_Flt_t *pVVar11;
  float *__ptr_01;
  Vec_Flt_t *pVVar12;
  float *__ptr_02;
  long lVar13;
  long lVar14;
  size_t sVar15;
  float Area;
  
  pBVar5 = (Bus_Man_t *)calloc(1,0x60);
  pBVar5->pPars = pPars;
  pBVar5->pNtk = pNtk;
  pBVar5->pLib = pLib;
  pSVar6 = Abc_SclFindInvertor(pLib,pPars->fAddBufs);
  pBVar5->pInv = pSVar6->pRepr->pPrev;
  if (pPars->fUseWireLoads != 0) {
    if (pNtk->pWLoadUsed == (char *)0x0) {
      lVar14 = (long)pNtk->vObjs->nSize;
      if (lVar14 < 1) {
        Area = 0.0;
      }
      else {
        Area = 0.0;
        lVar13 = 0;
        do {
          plVar2 = (long *)pNtk->vObjs->pArray[lVar13];
          if ((((plVar2 != (long *)0x0) && ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 7)) &&
              (*(int *)((long)plVar2 + 0x1c) != 0)) &&
             (((lVar3 = *plVar2, *(int *)((long)plVar2 + 0x1c) != 1 || (*(int *)(lVar3 + 4) != 4))
              || (plVar2[7] != 0)))) {
            iVar4 = (int)plVar2[2];
            if (((long)iVar4 < 0) || (*(int *)(*(long *)(lVar3 + 0x178) + 4) <= iVar4)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            iVar4 = *(int *)(*(long *)(*(long *)(lVar3 + 0x178) + 8) + (long)iVar4 * 4);
            if (((long)iVar4 < 0) || (*(int *)(*(long *)(lVar3 + 0x170) + 100) <= iVar4)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            Area = Area + *(float *)(*(long *)(*(long *)(*(long *)(lVar3 + 0x170) + 0x68) +
                                              (long)iVar4 * 8) + 0x18);
          }
          lVar13 = lVar13 + 1;
        } while (lVar14 != lVar13);
      }
      pWL = Abc_SclFindWireLoadModel(pLib,Area);
      pBVar5->pWLoadUsed = pWL;
      if (pWL == (SC_WireLoad *)0x0) goto LAB_00457cb2;
      __s = pWL->pName;
      if (__s == (char *)0x0) {
        __dest = (char *)0x0;
      }
      else {
        sVar15 = strlen(__s);
        __dest = (char *)malloc(sVar15 + 1);
        strcpy(__dest,__s);
      }
      pNtk->pWLoadUsed = __dest;
    }
    else {
      pWL = Abc_SclFetchWireLoadModel(pLib,pNtk->pWLoadUsed);
      pBVar5->pWLoadUsed = pWL;
      if (pWL == (SC_WireLoad *)0x0) goto LAB_00457cb2;
    }
    iVar4 = Abc_NtkGetFanoutMax(pNtk);
    pVVar9 = Abc_SclFindWireCaps(pWL,iVar4);
    pBVar5->vWireCaps = pVVar9;
  }
LAB_00457cb2:
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  ppvVar8 = (void **)malloc(800);
  pVVar7->pArray = ppvVar8;
  pBVar5->vFanouts = pVVar7;
  pVVar7 = pNtk->vObjs;
  uVar1 = pVVar7->nSize;
  pVVar9 = (Vec_Flt_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < uVar1 * 2 + 999) {
    iVar4 = uVar1 * 2 + 1000;
  }
  pVVar9->nSize = 0;
  pVVar9->nCap = iVar4;
  lVar14 = (long)iVar4;
  if (iVar4 == 0) {
    __ptr = (float *)0x0;
  }
  else {
    __ptr = (float *)malloc(lVar14 * 4);
  }
  pVVar9->pArray = __ptr;
  pBVar5->vCins = pVVar9;
  pVVar10 = (Vec_Flt_t *)malloc(0x10);
  pVVar10->nSize = 0;
  pVVar10->nCap = iVar4;
  if (iVar4 == 0) {
    __ptr_00 = (float *)0x0;
  }
  else {
    __ptr_00 = (float *)malloc(lVar14 * 4);
  }
  pVVar10->pArray = __ptr_00;
  pBVar5->vETimes = pVVar10;
  pVVar11 = (Vec_Flt_t *)malloc(0x10);
  pVVar11->nSize = 0;
  pVVar11->nCap = iVar4;
  if (iVar4 == 0) {
    __ptr_01 = (float *)0x0;
  }
  else {
    __ptr_01 = (float *)malloc(lVar14 * 4);
  }
  pVVar11->pArray = __ptr_01;
  pBVar5->vLoads = pVVar11;
  pVVar12 = (Vec_Flt_t *)malloc(0x10);
  pVVar12->nSize = 0;
  pVVar12->nCap = iVar4;
  if (iVar4 == 0) {
    __ptr_02 = (float *)0x0;
  }
  else {
    __ptr_02 = (float *)malloc(lVar14 << 2);
  }
  pVVar12->pArray = __ptr_02;
  pBVar5->vDepts = pVVar12;
  if (iVar4 < (int)uVar1) {
    if (__ptr == (float *)0x0) {
      __ptr = (float *)malloc((long)(int)uVar1 << 2);
    }
    else {
      __ptr = (float *)realloc(__ptr,(long)(int)uVar1 << 2);
    }
    pVVar9->pArray = __ptr;
    pVVar9->nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset(__ptr,0,(ulong)uVar1 * 4);
  }
  pVVar9->nSize = uVar1;
  uVar1 = pVVar7->nSize;
  if (iVar4 < (int)uVar1) {
    if (__ptr_00 == (float *)0x0) {
      __ptr_00 = (float *)malloc((long)(int)uVar1 << 2);
    }
    else {
      __ptr_00 = (float *)realloc(__ptr_00,(long)(int)uVar1 << 2);
    }
    pVVar10->pArray = __ptr_00;
    pVVar10->nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset(__ptr_00,0,(ulong)uVar1 * 4);
  }
  pVVar10->nSize = uVar1;
  uVar1 = pVVar7->nSize;
  if (iVar4 < (int)uVar1) {
    sVar15 = (long)(int)uVar1 * 4;
    if (__ptr_01 == (float *)0x0) {
      __ptr_01 = (float *)malloc(sVar15);
    }
    else {
      __ptr_01 = (float *)realloc(__ptr_01,sVar15);
    }
    pVVar11->pArray = __ptr_01;
    pVVar11->nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset(__ptr_01,0,(ulong)uVar1 * 4);
  }
  pVVar11->nSize = uVar1;
  if (iVar4 < (int)uVar1) {
    sVar15 = (long)(int)uVar1 << 2;
    if (__ptr_02 == (float *)0x0) {
      __ptr_02 = (float *)malloc(sVar15);
    }
    else {
      __ptr_02 = (float *)realloc(__ptr_02,sVar15);
    }
    pVVar12->pArray = __ptr_02;
    pVVar12->nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset(__ptr_02,0,(ulong)uVar1 * 4);
  }
  pVVar12->nSize = uVar1;
  pNtk->pBSMan = pBVar5;
  return pBVar5;
}

Assistant:

Bus_Man_t * Bus_ManStart( Abc_Ntk_t * pNtk, SC_Lib * pLib, SC_BusPars * pPars )
{
    Bus_Man_t * p;
    p = ABC_CALLOC( Bus_Man_t, 1 );
    p->pPars     = pPars;
    p->pNtk      = pNtk;
    p->pLib      = pLib;
    p->pInv      = Abc_SclFindInvertor(pLib, pPars->fAddBufs)->pRepr->pPrev;//->pAve;
    if ( pPars->fUseWireLoads )
    { 
        if ( pNtk->pWLoadUsed == NULL )
        {            
            p->pWLoadUsed = Abc_SclFindWireLoadModel( pLib, Abc_SclGetTotalArea(pNtk) );
            if ( p->pWLoadUsed )
            pNtk->pWLoadUsed = Abc_UtilStrsav( p->pWLoadUsed->pName );
        }
        else
            p->pWLoadUsed = Abc_SclFetchWireLoadModel( pLib, pNtk->pWLoadUsed );
    }
    if ( p->pWLoadUsed )
    p->vWireCaps = Abc_SclFindWireCaps( p->pWLoadUsed, Abc_NtkGetFanoutMax(pNtk) );
    p->vFanouts  = Vec_PtrAlloc( 100 );
    p->vCins     = Vec_FltAlloc( 2*Abc_NtkObjNumMax(pNtk) + 1000 );
    p->vETimes   = Vec_FltAlloc( 2*Abc_NtkObjNumMax(pNtk) + 1000 );
    p->vLoads    = Vec_FltAlloc( 2*Abc_NtkObjNumMax(pNtk) + 1000 );
    p->vDepts    = Vec_FltAlloc( 2*Abc_NtkObjNumMax(pNtk) + 1000 );
    Vec_FltFill( p->vCins,   Abc_NtkObjNumMax(pNtk), 0 );
    Vec_FltFill( p->vETimes, Abc_NtkObjNumMax(pNtk), 0 );
    Vec_FltFill( p->vLoads,  Abc_NtkObjNumMax(pNtk), 0 );
    Vec_FltFill( p->vDepts,  Abc_NtkObjNumMax(pNtk), 0 );
    pNtk->pBSMan = p;
    return p;
}